

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O1

void decode_dblock(void *block)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = *block;
  uVar3 = *(ulong *)((long)block + 8);
  uVar5 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18;
  uVar9 = uVar5 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  *(ulong *)block = uVar9;
  uVar6 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
          (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18;
  uVar8 = uVar6 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  *(ulong *)((long)block + 8) = uVar8;
  uVar4 = *(ulong *)((long)block + 0x10);
  *(ulong *)((long)block + 0x10) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x18);
  *(ulong *)((long)block + 0x18) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x20);
  *(ulong *)((long)block + 0x20) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x28);
  *(ulong *)((long)block + 0x28) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x30);
  *(ulong *)((long)block + 0x30) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x38);
  *(ulong *)((long)block + 0x38) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x40);
  *(ulong *)((long)block + 0x40) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)block + 0x48);
  *(ulong *)((long)block + 0x48) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  puVar1 = (ushort *)((long)block + 0x50);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  puVar1 = (ushort *)((long)block + 0x52);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  if ((uVar2 & 0xff00) == 0) {
    *(ulong *)((long)block + 0xfc5) = uVar9;
    *(undefined8 *)((long)block + 0xfcd) = 0;
    *(undefined8 *)((long)block + 0xfd5) = 0;
  }
  else {
    *(ulong *)((long)block + 0xfc5) = uVar5;
    *(ulong *)((long)block + 0xfcd) = (ulong)((uint)(uVar9 >> 0x35) & 7) - 1;
    *(ulong *)((long)block + 0xfd5) = (ulong)((ushort)(uVar9 >> 0x30) & 0x1f);
  }
  if ((uVar3 & 0xff00) == 0) {
    *(ulong *)((long)block + 0xfdd) = uVar9;
    *(undefined8 *)((long)block + 0xfe5) = 0;
    *(undefined8 *)((long)block + 0xfed) = 0;
  }
  else {
    *(ulong *)((long)block + 0xfdd) = uVar6;
    *(ulong *)((long)block + 0xfe5) = (ulong)((uint)(uVar8 >> 0x35) & 7) - 1;
    *(ulong *)((long)block + 0xfed) = (ulong)((ushort)(uVar8 >> 0x30) & 0x1f);
  }
  uVar2 = *(ulong *)((long)block + 0xff5);
  uVar3 = *(ulong *)((long)block + 0xffd);
  *(ulong *)((long)block + 0xff5) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  *(ulong *)((long)block + 0xffd) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar2 = *(ulong *)((long)block + 0x1007);
  *(ulong *)((long)block + 0x1007) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar7 = *(ushort *)((long)block + 0x1005) << 8 | *(ushort *)((long)block + 0x1005) >> 8;
  *(ushort *)((long)block + 0x1005) = uVar7;
  uVar2 = *(ulong *)((long)block + (ulong)uVar7);
  *(ulong *)((long)block + 0xfb5) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar2 = *(ulong *)((long)block + (ulong)uVar7 + 8);
  *(ulong *)((long)block + 0xfbd) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  return;
}

Assistant:

void decode_dblock(void *block) {
    dblock *_db = (dblock *)block;
    size_t subblock_no, idx;
    _db->trie_root_raw = _endian_decode(_db->trie_root_raw);
    _db->seqtree_root_raw =_endian_decode(_db->seqtree_root_raw);
    _db->staletree_root_raw=_endian_decode(_db->staletree_root_raw);
    _db->num_docs = _endian_decode(_db->num_docs);
    _db->num_deletes = _endian_decode(_db->num_deletes);
    _db->num_nodes = _endian_decode(_db->num_nodes);
    _db->data_size = _endian_decode(_db->data_size);
    _db->last_wal_flush_bid = _endian_decode(_db->
            last_wal_flush_bid);
    _db->kv_info_offset = _endian_decode(_db->kv_info_offset);
    _db->hdr_flags = _endian_decode(_db->hdr_flags);

    _db->new_filename_len = _endian_decode(_db->new_filename_len);
    _db->old_filename_len = _endian_decode(_db->old_filename_len);
    if (!is_subblock(_db->trie_root_raw)) {
        _db->trie_root_bid = _db->trie_root_raw;
        _db->trie_subblock_no = 0;
        _db->trie_idx = 0;
    } else {
        subbid2bid(_db->trie_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->trie_root_bid);
        _db->trie_subblock_no = subblock_no;
        _db->trie_idx = idx;
    }
    if (!is_subblock(_db->seqtree_root_raw)) {
        _db->seqtree_root_bid = _db->trie_root_raw;
        _db->seqtree_subblock_no = 0;
        _db->seqtree_idx = 0;
    } else {
        subbid2bid(_db->seqtree_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->seqtree_root_bid);
        _db->seqtree_subblock_no = subblock_no;
        _db->seqtree_idx = idx;
    }
    _db->delta_size = _endian_decode(_db->delta_size);
    _db->prev_hdr_bid = _endian_decode(_db->prev_hdr_bid);
    _db->magic_bytes = _endian_decode(_db->magic_bytes);
    _db->hdr_len = _endian_decode(_db->hdr_len);
    _db->revnum = *(uint64_t*)((char*)block + _db->hdr_len);
    _db->revnum = _endian_decode(_db->revnum);
    _db->seqnum = *(uint64_t*)((char*)block + _db->hdr_len + sizeof(uint64_t));
    _db->seqnum = _endian_decode(_db->seqnum);
}